

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DashTests.cpp
# Opt level: O0

void __thiscall agge::tests::DashTests::ThePatternIsAppliedPeriodically(DashTests *this)

{
  point pVar1;
  allocator local_301;
  string local_300 [32];
  LocationInfo local_2e0;
  undefined1 auStack_2b8 [8];
  point reference2 [5];
  undefined1 local_228 [8];
  point result2 [5];
  allocator local_1e1;
  string local_1e0 [32];
  LocationInfo local_1c0;
  undefined1 auStack_198 [8];
  point reference1 [7];
  undefined1 local_c8 [8];
  point result1 [7];
  undefined1 local_68 [8];
  dash d;
  DashTests *this_local;
  
  d._pattern._limit = (dash_gap *)this;
  dash::dash((dash *)local_68);
  dash::add_dash((dash *)local_68,5.0,10.0);
  move_to<agge::dash>((dash *)local_68,0.0,0.0);
  line_to<agge::dash>((dash *)local_68,44.99,0.0,false);
  pVar1 = vertex<agge::dash>((dash *)local_68);
  result1[0].x = (real_t)pVar1.command;
  local_c8 = pVar1._0_8_;
  pVar1 = vertex<agge::dash>((dash *)local_68);
  result1[1].x = (real_t)pVar1.command;
  result1[0]._4_8_ = pVar1._0_8_;
  pVar1 = vertex<agge::dash>((dash *)local_68);
  result1[2].x = (real_t)pVar1.command;
  result1[1]._4_8_ = pVar1._0_8_;
  pVar1 = vertex<agge::dash>((dash *)local_68);
  result1[3].x = (real_t)pVar1.command;
  result1[2]._4_8_ = pVar1._0_8_;
  pVar1 = vertex<agge::dash>((dash *)local_68);
  result1[4].x = (real_t)pVar1.command;
  result1[3]._4_8_ = pVar1._0_8_;
  pVar1 = vertex<agge::dash>((dash *)local_68);
  result1[5].x = (real_t)pVar1.command;
  result1[4]._4_8_ = pVar1._0_8_;
  pVar1 = vertex<agge::dash>((dash *)local_68);
  result1[6].x = (real_t)pVar1.command;
  result1[5]._4_8_ = pVar1._0_8_;
  reference1[4].command = 0;
  reference1[5].x = 2.8026e-45;
  reference1[5].y = 0.0;
  reference1[5].command = 0;
  reference1[3].y = 30.0;
  reference1[3].command = 0;
  reference1[4].x = 1.4013e-45;
  reference1[4].y = 35.0;
  reference1[2].x = 1.4013e-45;
  reference1[2].y = 20.0;
  reference1[2].command = 0;
  reference1[3].x = 2.8026e-45;
  reference1[0].command = 0;
  reference1[1].x = 2.8026e-45;
  reference1[1].y = 15.0;
  reference1[1].command = 0;
  auStack_198._0_4_ = 0.0;
  auStack_198._4_4_ = 0.0;
  reference1[0].x = 1.4013e-45;
  reference1[0].y = 5.0;
  reference1[6].x = 0.0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1e0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/DashTests.cpp"
             ,&local_1e1);
  ut::LocationInfo::LocationInfo(&local_1c0,(string *)local_1e0,0x8c);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,7ul>
            ((point (*) [7])auStack_198,(point (*) [7])local_c8,&local_1c0);
  ut::LocationInfo::~LocationInfo(&local_1c0);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  dash::remove_all_dashes((dash *)local_68);
  dash::add_dash((dash *)local_68,5.0,7.0);
  dash::remove_all((dash *)local_68);
  move_to<agge::dash>((dash *)local_68,0.0,0.0);
  line_to<agge::dash>((dash *)local_68,24.0,0.0,false);
  pVar1 = vertex<agge::dash>((dash *)local_68);
  result2[0].x = (real_t)pVar1.command;
  local_228 = pVar1._0_8_;
  pVar1 = vertex<agge::dash>((dash *)local_68);
  result2[1].x = (real_t)pVar1.command;
  result2[0]._4_8_ = pVar1._0_8_;
  pVar1 = vertex<agge::dash>((dash *)local_68);
  result2[2].x = (real_t)pVar1.command;
  result2[1]._4_8_ = pVar1._0_8_;
  pVar1 = vertex<agge::dash>((dash *)local_68);
  result2[3].x = (real_t)pVar1.command;
  result2[2]._4_8_ = pVar1._0_8_;
  pVar1 = vertex<agge::dash>((dash *)local_68);
  result2[4].x = (real_t)pVar1.command;
  unique0x100003f4 = pVar1._0_8_;
  reference2[3].y = 0.0;
  reference2[3].command = 0;
  reference2[4].x = 0.0;
  reference2[2].x = 1.4013e-45;
  reference2[2].y = 17.0;
  reference2[2].command = 0;
  reference2[3].x = 2.8026e-45;
  reference2[0].command = 0;
  reference2[1].x = 2.8026e-45;
  reference2[1].y = 12.0;
  reference2[1].command = 0;
  auStack_2b8._0_4_ = 0.0;
  auStack_2b8._4_4_ = 0.0;
  reference2[0].x = 1.4013e-45;
  reference2[0].y = 5.0;
  result2[3]._4_8_ = unique0x100003f4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_300,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/DashTests.cpp"
             ,&local_301);
  ut::LocationInfo::LocationInfo(&local_2e0,(string *)local_300,0xa5);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,5ul>
            ((point (*) [5])auStack_2b8,(point (*) [5])local_228,&local_2e0);
  ut::LocationInfo::~LocationInfo(&local_2e0);
  std::__cxx11::string::~string(local_300);
  std::allocator<char>::~allocator((allocator<char> *)&local_301);
  dash::~dash((dash *)local_68);
  return;
}

Assistant:

test( ThePatternIsAppliedPeriodically )
			{
				// INIT
				dash d;

				d.add_dash(5.0f, 10.0f);

				// ACT
				move_to(d, 0.0f, 0.0f);
				line_to(d, 44.99f, 0.0f);
				mocks::path::point result1[] = {
					vertex(d), vertex(d),
					vertex(d), vertex(d),
					vertex(d), vertex(d),
					vertex(d),
				};

				// ASSERT
				mocks::path::point reference1[] = {
					{ 0.0f, 0.0f, path_command_move_to },
					{ 5.0f, 0.0f, path_command_line_to },
					{ 15.0f, 0.0f, path_command_move_to },
					{ 20.0f, 0.0f, path_command_line_to },
					{ 30.0f, 0.0f, path_command_move_to },
					{ 35.0f, 0.0f, path_command_line_to },
					{ 0.0f, 0.0f, path_command_stop },
				};

				assert_equal(reference1, result1);

				// INIT
				d.remove_all_dashes();
				d.add_dash(5.0f, 7.0f);
				d.remove_all();

				// ACT (pattern end coincides with segment end)
				move_to(d, 0.0f, 0.0f);
				line_to(d, 24.0f, 0.0f);
				mocks::path::point result2[] = {
					vertex(d), vertex(d),
					vertex(d), vertex(d),
					vertex(d),
				};

				// ASSERT
				mocks::path::point reference2[] = {
					{ 0.0f, 0.0f, path_command_move_to },
					{ 5.0f, 0.0f, path_command_line_to },
					{ 12.0f, 0.0f, path_command_move_to },
					{ 17.0f, 0.0f, path_command_line_to },
					{ 0.0f, 0.0f, path_command_stop },
				};

				assert_equal(reference2, result2);
			}